

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::AddDeprecatedFlag
          (FieldGeneratorBase *this,Printer *printer)

{
  Type TVar1;
  Descriptor *pDVar2;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x38) + 0x4e) != '\0') {
LAB_002ecc3c:
    io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
    return;
  }
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 == TYPE_MESSAGE) {
    pDVar2 = FieldDescriptor::message_type(this->descriptor_);
    if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x4a) == '\x01') goto LAB_002ecc3c;
  }
  return;
}

Assistant:

void FieldGeneratorBase::AddDeprecatedFlag(io::Printer* printer) {
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  } else if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE &&
           descriptor_->message_type()->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
}